

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O0

int absl::lts_20250127::str_format_internal::ParseDigits(char *c,char **pos,char *end)

{
  char *pcVar1;
  int local_28;
  int local_24;
  int num_digits;
  int digits;
  char *end_local;
  char **pos_local;
  char *c_local;
  
  local_24 = (int)*c;
  local_28 = 9;
  while( true ) {
    local_24 = local_24 + -0x30;
    if (*pos == end) {
      return local_24;
    }
    pcVar1 = *pos;
    *pos = pcVar1 + 1;
    *c = *pcVar1;
    if (*c < '0') {
      return local_24;
    }
    if ('9' < *c) {
      return local_24;
    }
    local_28 = local_28 + -1;
    if (local_28 == 0) break;
    local_24 = local_24 * 10 + (int)*c;
  }
  return local_24;
}

Assistant:

constexpr int ParseDigits(char& c, const char*& pos, const char* const end) {
  int digits = c - '0';
  // We do not want to overflow `digits` so we consume at most digits10
  // digits. If there are more digits the parsing will fail later on when the
  // digit doesn't match the expected characters.
  int num_digits = std::numeric_limits<int>::digits10;
  for (;;) {
    if (ABSL_PREDICT_FALSE(pos == end)) break;
    c = *pos++;
    if ('0' > c || c > '9') break;
    --num_digits;
    if (ABSL_PREDICT_FALSE(!num_digits)) break;
    digits = 10 * digits + c - '0';
  }
  return digits;
}